

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

spv_result_t
spvValidateWithOptions
          (spv_const_context context,spv_const_validator_options options,spv_const_binary binary,
          spv_diagnostic *pDiagnostic)

{
  spv_result_t sVar1;
  undefined1 local_790 [8];
  ValidationState_t vstate;
  spv_context_t hijack_context;
  spv_diagnostic *pDiagnostic_local;
  spv_const_binary binary_local;
  spv_const_validator_options options_local;
  spv_const_context context_local;
  
  spv_context_t::spv_context_t((spv_context_t *)&vstate.num_of_warnings_,context);
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    spvtools::UseDiagnosticAsMessageConsumer((spv_context)&vstate.num_of_warnings_,pDiagnostic);
  }
  spvtools::val::ValidationState_t::ValidationState_t
            ((ValidationState_t *)local_790,(spv_const_context)&vstate.num_of_warnings_,options,
             binary->code,binary->wordCount,(anonymous_namespace)::kDefaultMaxNumOfWarnings);
  sVar1 = spvtools::val::anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    ((spv_context_t *)&vstate.num_of_warnings_,binary->code,binary->wordCount,
                     pDiagnostic,(ValidationState_t *)local_790);
  spvtools::val::ValidationState_t::~ValidationState_t((ValidationState_t *)local_790);
  spv_context_t::~spv_context_t((spv_context_t *)&vstate.num_of_warnings_);
  return sVar1;
}

Assistant:

spv_result_t spvValidateWithOptions(const spv_const_context context,
                                    spv_const_validator_options options,
                                    const spv_const_binary binary,
                                    spv_diagnostic* pDiagnostic) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    spvtools::UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  // Create the ValidationState using the context.
  spvtools::val::ValidationState_t vstate(&hijack_context, options,
                                          binary->code, binary->wordCount,
                                          kDefaultMaxNumOfWarnings);

  return spvtools::val::ValidateBinaryUsingContextAndValidationState(
      hijack_context, binary->code, binary->wordCount, pDiagnostic, &vstate);
}